

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

void Acb_NtkSaveSupport(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  (p->vSuppOld).nSize = 0;
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if (iObj < (p->vObjFans).nSize) {
    iVar1 = (p->vObjFans).pArray[(uint)iObj];
    lVar5 = (long)iVar1;
    if ((-1 < lVar5) && (iVar1 < (p->vFanSto).nSize)) {
      piVar2 = (p->vFanSto).pArray;
      if (0 < piVar2[lVar5]) {
        lVar4 = 0;
        do {
          lVar3 = lVar4 + 1;
          lVar4 = lVar4 + 1;
          Vec_IntPush(&p->vSuppOld,piVar2[lVar5 + lVar3]);
        } while (lVar4 < piVar2[lVar5]);
      }
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acb_NtkSaveSupport( Acb_Ntk_t * p, int iObj )
{
    int k, iFanin, * pFanins; 
    Vec_IntClear( &p->vSuppOld );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        Vec_IntPush( &p->vSuppOld, iFanin );
}